

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O2

string * vkt::tessellation::anon_unknown_2::generateTessellationEvaluationShader
                   (string *__return_storage_ptr__,TessPrimitiveType primitiveType,
                   string *colorOutputName)

{
  char *pcVar1;
  ostream *poVar2;
  ostringstream src;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"#extension GL_EXT_tessellation_shader : require\n");
  poVar2 = std::operator<<(poVar2,"layout(");
  if (primitiveType < TESSPRIMITIVETYPE_LAST) {
    pcVar1 = *(char **)(&DAT_00c09428 + (ulong)primitiveType * 8);
  }
  else {
    pcVar1 = (char *)0x0;
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,") in;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  highp vec4 v_patch_color[];\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec4 ");
  poVar2 = std::operator<<(poVar2,(string *)colorOutputName);
  poVar2 = std::operator<<(poVar2,";\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,
                           "// note: No need to use precise gl_Position since we do not require gapless geometry\n"
                          );
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  std::operator<<(poVar2,"{\n");
  if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    poVar2 = std::operator<<((ostream *)&src,
                             "    vec3 weights = vec3(pow(gl_TessCoord.x, 1.3), pow(gl_TessCoord.y, 1.3), pow(gl_TessCoord.z, 1.3));\n"
                            );
    poVar2 = std::operator<<(poVar2,"    vec3 cweights = gl_TessCoord;\n");
    poVar2 = std::operator<<(poVar2,
                             "    gl_Position = vec4(weights.x * gl_in[0].gl_Position.xyz + weights.y * gl_in[1].gl_Position.xyz + weights.z * gl_in[2].gl_Position.xyz, 1.0);\n"
                            );
    poVar2 = std::operator<<(poVar2,"    ");
    poVar2 = std::operator<<(poVar2,(string *)colorOutputName);
    pcVar1 = 
    " = cweights.x * v_patch_color[0] + cweights.y * v_patch_color[1] + cweights.z * v_patch_color[2];\n"
    ;
  }
  else {
    if (TESSPRIMITIVETYPE_ISOLINES < primitiveType) goto LAB_00736d03;
    poVar2 = std::operator<<((ostream *)&src,
                             "    vec2 normalizedCoord = (gl_TessCoord.xy * 2.0 - vec2(1.0));\n");
    poVar2 = std::operator<<(poVar2,
                             "    vec2 normalizedWeights = normalizedCoord * (vec2(1.0) - 0.3 * cos(normalizedCoord.yx * 1.57));\n"
                            );
    poVar2 = std::operator<<(poVar2,"    vec2 weights = normalizedWeights * 0.5 + vec2(0.5);\n");
    poVar2 = std::operator<<(poVar2,"    vec2 cweights = gl_TessCoord.xy;\n");
    poVar2 = std::operator<<(poVar2,
                             "    gl_Position = mix(mix(gl_in[0].gl_Position, gl_in[1].gl_Position, weights.y), mix(gl_in[2].gl_Position, gl_in[3].gl_Position, weights.y), weights.x);\n"
                            );
    poVar2 = std::operator<<(poVar2,"    ");
    poVar2 = std::operator<<(poVar2,(string *)colorOutputName);
    pcVar1 = 
    " = mix(mix(v_patch_color[0], v_patch_color[1], cweights.y), mix(v_patch_color[2], v_patch_color[3], cweights.y), cweights.x);\n"
    ;
  }
  std::operator<<(poVar2,pcVar1);
LAB_00736d03:
  std::operator<<((ostream *)&src,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return __return_storage_ptr__;
}

Assistant:

std::string generateTessellationEvaluationShader (const TessPrimitiveType primitiveType, const std::string& colorOutputName)
{
	std::ostringstream	src;
	src <<	glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
		<< "#extension GL_EXT_tessellation_shader : require\n"
		<< "layout(" << getTessPrimitiveTypeShaderName(primitiveType) << ") in;\n"
		<< "\n"
		<< "layout(location = 0) in  highp vec4 v_patch_color[];\n"
		<< "layout(location = 0) out highp vec4 " << colorOutputName << ";\n"
		<< "\n"
		<< "// note: No need to use precise gl_Position since we do not require gapless geometry\n"
		<< "void main (void)\n"
		<< "{\n";

	if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
		src << "    vec3 weights = vec3(pow(gl_TessCoord.x, 1.3), pow(gl_TessCoord.y, 1.3), pow(gl_TessCoord.z, 1.3));\n"
			<< "    vec3 cweights = gl_TessCoord;\n"
			<< "    gl_Position = vec4(weights.x * gl_in[0].gl_Position.xyz + weights.y * gl_in[1].gl_Position.xyz + weights.z * gl_in[2].gl_Position.xyz, 1.0);\n"
			<< "    " << colorOutputName << " = cweights.x * v_patch_color[0] + cweights.y * v_patch_color[1] + cweights.z * v_patch_color[2];\n";
	else if (primitiveType == TESSPRIMITIVETYPE_QUADS || primitiveType == TESSPRIMITIVETYPE_ISOLINES)
		src << "    vec2 normalizedCoord = (gl_TessCoord.xy * 2.0 - vec2(1.0));\n"
			<< "    vec2 normalizedWeights = normalizedCoord * (vec2(1.0) - 0.3 * cos(normalizedCoord.yx * 1.57));\n"
			<< "    vec2 weights = normalizedWeights * 0.5 + vec2(0.5);\n"
			<< "    vec2 cweights = gl_TessCoord.xy;\n"
			<< "    gl_Position = mix(mix(gl_in[0].gl_Position, gl_in[1].gl_Position, weights.y), mix(gl_in[2].gl_Position, gl_in[3].gl_Position, weights.y), weights.x);\n"
			<< "    " << colorOutputName << " = mix(mix(v_patch_color[0], v_patch_color[1], cweights.y), mix(v_patch_color[2], v_patch_color[3], cweights.y), cweights.x);\n";
	else
		DE_ASSERT(false);

	src <<	"}\n";

	return src.str();
}